

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlog_is_on.cc
# Opt level: O3

bool google::InitVLOG3__(SiteFlag *site_flag,int32 *level_default,char *fname,int32 verbose_level)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  size_t str_len;
  undefined1 local_80 [8];
  string pattern;
  MutexLock local_50;
  MutexLock l;
  
  local_50.mu_ = (Mutex *)vmodule_lock;
  if ((vmodule_lock[0x38] == '\x01') &&
     (iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)vmodule_lock), iVar3 != 0)) {
    abort();
  }
  cVar1 = inited_vmodule;
  if (inited_vmodule == '\0') {
    inited_vmodule = 0;
    pcVar6 = (char *)*fLS::FLAGS_vmodule_abi_cxx11_;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pattern.field_2._8_8_ = site_flag;
    l.mu_._4_4_ = verbose_level;
    do {
      pcVar4 = strchr(pcVar6,0x3d);
      this = pbVar7;
      pbVar8 = pbVar5;
      if (pcVar4 == (char *)0x0) break;
      local_80 = (undefined1  [8])&pattern._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,pcVar6,pcVar4);
      iVar3 = __isoc99_sscanf(pcVar4,"=%d",&l);
      if (iVar3 == 1) {
        this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x30);
        (this->_M_dataplus)._M_p = (pointer)&this->field_2;
        this->_M_string_length = 0;
        (this->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_80);
        *(undefined4 *)&this[1]._M_dataplus._M_p = l.mu_._0_4_;
        pbVar8 = this;
        if (pbVar5 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pbVar7[1]._M_string_length = (size_type)this;
          pbVar8 = pbVar5;
        }
      }
      pcVar4 = strchr(pcVar4,0x2c);
      if (local_80 != (undefined1  [8])&pattern._M_string_length) {
        operator_delete((void *)local_80,pattern._M_string_length + 1);
      }
      pcVar6 = pcVar4 + 1;
      pbVar7 = this;
      pbVar5 = pbVar8;
    } while (pcVar4 != (char *)0x0);
    if (pbVar8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this[1]._M_string_length = (size_type)vmodule_list;
      vmodule_list = pbVar8;
    }
    inited_vmodule = '\x01';
    site_flag = (SiteFlag *)pattern.field_2._8_8_;
    verbose_level = l.mu_._4_4_;
  }
  pcVar4 = strrchr(fname,0x2f);
  pcVar6 = pcVar4 + 1;
  if (pcVar4 == (char *)0x0) {
    pcVar6 = fname;
  }
  pcVar4 = strchr(pcVar6,0x2e);
  if (pcVar4 == (char *)0x0) {
    str_len = strlen(pcVar6);
  }
  else {
    str_len = (long)pcVar4 - (long)pcVar6;
  }
  pbVar7 = vmodule_list;
  if ((3 < str_len) && (*(int *)(pcVar6 + (str_len - 4)) == 0x6c6e692d)) {
    str_len = str_len - 4;
  }
  do {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)level_default;
    if (pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_001283e9:
      if (((cVar1 != '\0') &&
          (site_flag->level = (int32 *)pbVar5,
          pbVar5 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    level_default)) && (site_flag->base_name == (char *)0x0)) {
        site_flag->base_name = pcVar6;
        site_flag->base_len = str_len;
        site_flag->next = cached_site_list;
        cached_site_list = site_flag;
      }
      iVar3 = *(int *)&(pbVar5->_M_dataplus)._M_p;
      ::glog_internal_namespace_::MutexLock::~MutexLock(&local_50);
      return verbose_level <= iVar3;
    }
    bVar2 = glog_internal_namespace_::SafeFNMatch_
                      ((pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length,pcVar6,str_len);
    if (bVar2) {
      pbVar5 = pbVar7 + 1;
      goto LAB_001283e9;
    }
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             pbVar7[1]._M_string_length;
  } while( true );
}

Assistant:

bool InitVLOG3__(SiteFlag* site_flag, int32* level_default,
                 const char* fname, int32 verbose_level) {
  MutexLock l(&vmodule_lock);
  bool read_vmodule_flag = inited_vmodule;
  if (!read_vmodule_flag) {
    VLOG2Initializer();
  }

  // protect the errno global in case someone writes:
  // VLOG(..) << "The last error was " << strerror(errno)
  int old_errno = errno;

  // site_default normally points to FLAGS_v
  int32* site_flag_value = level_default;

  // Get basename for file
  const char* base = strrchr(fname, '/');

#ifdef _WIN32
  if (!base) {
    base = strrchr(fname, '\\');
  }
#endif

  base = base ? (base+1) : fname;
  const char* base_end = strchr(base, '.');
  size_t base_length = base_end ? size_t(base_end - base) : strlen(base);

  // Trim out trailing "-inl" if any
  if (base_length >= 4 && (memcmp(base+base_length-4, "-inl", 4) == 0)) {
    base_length -= 4;
  }

  // TODO: Trim out _unittest suffix?  Perhaps it is better to have
  // the extra control and just leave it there.

  // find target in vector of modules, replace site_flag_value with
  // a module-specific verbose level, if any.
  for (const VModuleInfo* info = vmodule_list;
       info != NULL; info = info->next) {
    if (SafeFNMatch_(info->module_pattern.c_str(), info->module_pattern.size(),
                     base, base_length)) {
      site_flag_value = &info->vlog_level;
        // value at info->vlog_level is now what controls
        // the VLOG at the caller site forever
      break;
    }
  }

  // Cache the vlog value pointer if --vmodule flag has been parsed.
  ANNOTATE_BENIGN_RACE(site_flag,
                       "*site_flag may be written by several threads,"
                       " but the value will be the same");
  if (read_vmodule_flag) {
    site_flag->level = site_flag_value;
    // If VLOG flag has been cached to the default site pointer,
    // we want to add to the cached list in order to invalidate in case
    // SetVModule is called afterwards with new modules.
    // The performance penalty here is neglible, because InitVLOG3__ is called
    // once per site.
    if (site_flag_value == level_default && !site_flag->base_name) {
      site_flag->base_name = base;
      site_flag->base_len = base_length;
      site_flag->next = cached_site_list;
      cached_site_list = site_flag;
    }
  }

  // restore the errno in case something recoverable went wrong during
  // the initialization of the VLOG mechanism (see above note "protect the..")
  errno = old_errno;
  return *site_flag_value >= verbose_level;
}